

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cosine_window.cc
# Opt level: O0

void __thiscall
sptk::CosineWindow::CosineWindow
          (CosineWindow *this,int window_length,vector<double,_std::allocator<double>_> *alpha,
          bool periodic)

{
  double dVar1;
  bool bVar2;
  int iVar3;
  reference pvVar4;
  size_type sVar5;
  const_reference pvVar6;
  byte in_CL;
  vector<double,_std::allocator<double>_> *in_RDX;
  undefined4 in_ESI;
  vector<double,_std::allocator<double>_> *in_RDI;
  double dVar7;
  int k;
  int sign;
  double sum;
  int i;
  double *window;
  double m;
  int alpha_size;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  pointer *__new_size;
  int local_58;
  int local_54;
  double local_50;
  int local_44;
  
  WindowInterface::WindowInterface((WindowInterface *)in_RDI);
  (in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
  _M_start = (pointer)&PTR__CosineWindow_00129d08;
  *(undefined4 *)
   &(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
    _M_finish = in_ESI;
  *(byte *)((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish + 4) = in_CL & 1;
  *(undefined1 *)
   ((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish + 5) = 1;
  __new_size = &(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_end_of_storage;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x11e4f7);
  if ((0 < *(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_finish) &&
     (bVar2 = std::vector<double,_std::allocator<double>_>::empty
                        ((vector<double,_std::allocator<double>_> *)
                         CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90)), !bVar2)) {
    std::vector<double,_std::allocator<double>_>::resize(in_RDI,(size_type)__new_size);
    if (*(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish == 1) {
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)
                          &(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_end_of_storage,0);
      *pvVar4 = 1.0;
      return;
    }
    sVar5 = std::vector<double,_std::allocator<double>_>::size(in_RDX);
    if (((ulong)(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish & 0x100000000) == 0) {
      iVar3 = *(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish + -1;
    }
    else {
      iVar3 = *(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
    }
    pvVar4 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)
                        &(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_end_of_storage,0);
    for (local_44 = 0;
        local_44 <
        *(int *)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                 super__Vector_impl_data._M_finish; local_44 = local_44 + 1) {
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,0);
      local_50 = *pvVar6;
      local_54 = -1;
      for (local_58 = 1; local_58 < (int)sVar5; local_58 = local_58 + 1) {
        pvVar6 = std::vector<double,_std::allocator<double>_>::operator[](in_RDX,(long)local_58);
        dVar1 = *pvVar6;
        dVar7 = cos((double)(local_44 * local_58) * (6.283185307179586 / (double)iVar3));
        local_50 = (double)local_54 * dVar1 * dVar7 + local_50;
        local_54 = -local_54;
      }
      pvVar4[local_44] = local_50;
    }
    return;
  }
  *(undefined1 *)
   ((long)&(in_RDI->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
           super__Vector_impl_data._M_finish + 5) = 0;
  return;
}

Assistant:

CosineWindow::CosineWindow(int window_length, const std::vector<double>& alpha,
                           bool periodic)
    : window_length_(window_length), periodic_(periodic), is_valid_(true) {
  if (window_length_ <= 0 || alpha.empty()) {
    is_valid_ = false;
    return;
  }

  window_.resize(window_length_);
  if (1 == window_length_) {
    window_[0] = 1.0;
    return;
  }

  const int alpha_size(static_cast<int>(alpha.size()));
  const double m(kTwoPi / (periodic_ ? window_length_ : window_length_ - 1));
  double* window(&(window_[0]));
  for (int i(0); i < window_length_; ++i) {
    double sum(alpha[0]);
    int sign(-1);
    for (int k(1); k < alpha_size; ++k) {
      sum += sign * alpha[k] * std::cos(i * k * m);
      sign *= -1;
    }
    window[i] = sum;
  }
}